

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O0

int lgx_co_suspend(lgx_vm_t *vm)

{
  lgx_co_t *list;
  lgx_co_t *co;
  lgx_vm_t *vm_local;
  
  if (vm->co_running != (lgx_co_t *)0x0) {
    list = vm->co_running;
    list->status = CO_SUSPEND;
    if (list->on_yield != (_func_int_lgx_vm_t_ptr *)0x0) {
      (*list->on_yield)(vm);
    }
    if (vm->co_running == list) {
      vm->co_running = (lgx_co_t *)0x0;
    }
    lgx_list_add_tail(&list->head,&vm->co_suspend);
    return 0;
  }
  __assert_fail("vm->co_running",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                ,0xe1,"int lgx_co_suspend(lgx_vm_t *)");
}

Assistant:

int lgx_co_suspend(lgx_vm_t *vm) {
    assert(vm->co_running);

    lgx_co_t *co = vm->co_running;
    co->status = CO_SUSPEND;

    if (co->on_yield) {
        co->on_yield(vm);
    }

    if (vm->co_running == co) {
        vm->co_running = NULL;
    }
    lgx_list_add_tail(&co->head, &vm->co_suspend);

    return 0;
}